

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O0

void test_large_deflate(uchar *compr,size_t comprLen,uchar *uncompr,size_t uncomprLen,int zng_params
                       )

{
  int in_ECX;
  int in_EDI;
  int in_R8D;
  zng_deflate_param_value params [2];
  int strategy;
  int level;
  int err;
  zng_stream c_stream;
  undefined4 local_e8 [2];
  uint *local_e0;
  undefined8 local_d8;
  undefined4 local_c8;
  uint *local_c0;
  undefined8 local_b8;
  uint local_9c;
  uint local_98;
  uint local_94;
  undefined1 local_90 [8];
  uint local_88;
  int local_78;
  alloc_func local_50;
  free_func local_48;
  undefined8 local_40;
  int local_24;
  
  local_98 = 0xffffffff;
  local_9c = 0xffffffff;
  local_e8[0] = 0;
  local_e0 = &local_98;
  local_d8 = 4;
  local_c8 = 1;
  local_c0 = &local_9c;
  local_b8 = 4;
  local_50 = zalloc;
  local_48 = zfree;
  local_40 = 0;
  local_24 = in_R8D;
  local_88 = in_ECX;
  local_94 = zng_deflateInit(local_90,1);
  if (local_94 != 0) {
    error("%s error: %d\n","deflateInit",(ulong)local_94);
  }
  local_78 = in_EDI;
  local_94 = zng_deflate(local_90,0);
  if (local_94 != 0) {
    error("%s error: %d\n","deflate",(ulong)local_94);
  }
  if (local_88 != 0) {
    error("deflate not greedy\n");
  }
  if (local_24 == 0) {
    zng_deflateParams(local_90,0);
  }
  else {
    zng_deflateGetParams(local_90,local_e8,2);
    if (local_98 != 1) {
      error("Expected compression level Z_BEST_SPEED, got %d\n",(ulong)local_98);
    }
    if (local_9c != 0) {
      error("Expected compression strategy Z_DEFAULT_STRATEGY, got %d\n",(ulong)local_9c);
    }
    local_98 = 0;
    local_9c = 0;
    zng_deflateSetParams(local_90,local_e8,2);
  }
  diff = local_78 - in_EDI;
  local_88 = diff;
  local_94 = zng_deflate(local_90,0);
  if (local_94 != 0) {
    error("%s error: %d\n","deflate",(ulong)local_94);
  }
  if (local_24 == 0) {
    zng_deflateParams(local_90,9,1);
  }
  else {
    local_98 = 0xffffffff;
    local_9c = 0xffffffff;
    zng_deflateGetParams(local_90,local_e8,2);
    if (local_98 != 0) {
      error("Expected compression level Z_NO_COMPRESSION, got %d\n",(ulong)local_98);
    }
    if (local_9c != 0) {
      error("Expected compression strategy Z_DEFAULT_STRATEGY, got %d\n",(ulong)local_9c);
    }
    local_98 = 9;
    local_9c = 1;
    zng_deflateSetParams(local_90,local_e8,2);
  }
  local_94 = zng_deflate(local_90,0);
  if (local_94 != 0) {
    error("%s error: %d\n","deflate",(ulong)local_94);
  }
  local_94 = zng_deflate(local_90,4);
  if (local_94 != 1) {
    error("deflate should report Z_STREAM_END\n");
  }
  local_94 = zng_deflateEnd(local_90);
  if (local_94 != 0) {
    error("%s error: %d\n","deflateEnd",(ulong)local_94);
  }
  return;
}

Assistant:

static void test_large_deflate(unsigned char *compr, size_t comprLen, unsigned char *uncompr, size_t uncomprLen, int zng_params) {
    PREFIX3(stream) c_stream; /* compression stream */
    int err;
#ifndef ZLIB_COMPAT
    int level = -1;
    int strategy = -1;
    zng_deflate_param_value params[2];

    params[0].param = Z_DEFLATE_LEVEL;
    params[0].buf = &level;
    params[0].size = sizeof(level);

    params[1].param = Z_DEFLATE_STRATEGY;
    params[1].buf = &strategy;
    params[1].size = sizeof(strategy);
#endif

    c_stream.zalloc = zalloc;
    c_stream.zfree = zfree;
    c_stream.opaque = (void *)0;

    err = PREFIX(deflateInit)(&c_stream, Z_BEST_SPEED);
    CHECK_ERR(err, "deflateInit");

    c_stream.next_out = compr;
    c_stream.avail_out = (unsigned int)comprLen;

    /* At this point, uncompr is still mostly zeroes, so it should compress
     * very well:
     */
    c_stream.next_in = uncompr;
    c_stream.avail_in = (unsigned int)uncomprLen;
    err = PREFIX(deflate)(&c_stream, Z_NO_FLUSH);
    CHECK_ERR(err, "deflate");
    if (c_stream.avail_in != 0)
        error("deflate not greedy\n");

    /* Feed in already compressed data and switch to no compression: */
    if (zng_params) {
#ifndef ZLIB_COMPAT
        zng_deflateGetParams(&c_stream, params, sizeof(params) / sizeof(params[0]));
        if (level != Z_BEST_SPEED)
            error("Expected compression level Z_BEST_SPEED, got %d\n", level);
        if (strategy != Z_DEFAULT_STRATEGY)
            error("Expected compression strategy Z_DEFAULT_STRATEGY, got %d\n", strategy);
        level = Z_NO_COMPRESSION;
        strategy = Z_DEFAULT_STRATEGY;
        zng_deflateSetParams(&c_stream, params, sizeof(params) / sizeof(params[0]));
#else
        error("test_large_deflate() called with zng_params=1 in compat mode\n");
#endif
    } else {
        PREFIX(deflateParams)(&c_stream, Z_NO_COMPRESSION, Z_DEFAULT_STRATEGY);
    }
    c_stream.next_in = compr;
    diff = (unsigned int)(c_stream.next_out - compr);
    c_stream.avail_in = diff;
    err = PREFIX(deflate)(&c_stream, Z_NO_FLUSH);
    CHECK_ERR(err, "deflate");

    /* Switch back to compressing mode: */
    if (zng_params) {
#ifndef ZLIB_COMPAT
        level = -1;
        strategy = -1;
        zng_deflateGetParams(&c_stream, params, sizeof(params) / sizeof(params[0]));
        if (level != Z_NO_COMPRESSION)
            error("Expected compression level Z_NO_COMPRESSION, got %d\n", level);
        if (strategy != Z_DEFAULT_STRATEGY)
            error("Expected compression strategy Z_DEFAULT_STRATEGY, got %d\n", strategy);
        level = Z_BEST_COMPRESSION;
        strategy = Z_FILTERED;
        zng_deflateSetParams(&c_stream, params, sizeof(params) / sizeof(params[0]));
#else
        error("test_large_deflate() called with zng_params=1 in compat mode\n");
#endif
    } else {
        PREFIX(deflateParams)(&c_stream, Z_BEST_COMPRESSION, Z_FILTERED);
    }
    c_stream.next_in = uncompr;
    c_stream.avail_in = (unsigned int)uncomprLen;
    err = PREFIX(deflate)(&c_stream, Z_NO_FLUSH);
    CHECK_ERR(err, "deflate");

    err = PREFIX(deflate)(&c_stream, Z_FINISH);
    if (err != Z_STREAM_END)
        error("deflate should report Z_STREAM_END\n");
    err = PREFIX(deflateEnd)(&c_stream);
    CHECK_ERR(err, "deflateEnd");
}